

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CD_Scene.h
# Opt level: O0

Scalar __thiscall sch::CD_Scene::getWitnessPoints(CD_Scene *this,int a,int b,Point3 *p1,Point3 *p2)

{
  reference pvVar1;
  reference pvVar2;
  reference this_00;
  reference pvVar3;
  Point3 *p2_local;
  Point3 *p1_local;
  int b_local;
  int a_local;
  CD_Scene *this_local;
  
  if (a == b) {
    this_local = (CD_Scene *)0x0;
  }
  else {
    pvVar1 = std::
             vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
             ::operator[]((vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
                           *)(this + 0x38),(long)a);
    pvVar2 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[](pvVar1,(long)b);
    p1->m_x = pvVar2->m_x;
    p1->m_y = pvVar2->m_y;
    p1->m_z = pvVar2->m_z;
    pvVar1 = std::
             vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
             ::operator[]((vector<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>,_std::allocator<std::vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>_>_>
                           *)(this + 0x38),(long)b);
    pvVar2 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[](pvVar1,(long)a);
    p2->m_x = pvVar2->m_x;
    p2->m_y = pvVar2->m_y;
    p2->m_z = pvVar2->m_z;
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(this + 0x50),(long)a);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)b);
    this_local = (CD_Scene *)*pvVar3;
  }
  return (Scalar)this_local;
}

Assistant:

SCH_API Scalar getWitnessPoints(int a, int b, Point3 & p1, Point3 & p2)
  {
    if(a != b)
    {
      p1 = witness_[a][b];
      p2 = witness_[b][a];
      return distances_[a][b];
    }
    else
    {
      return 0;
    }
  }